

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCMPrint.cpp
# Opt level: O2

void processComplexTypeDefinition(XSComplexTypeDefinition *xsComplexTypeDef)

{
  uint uVar1;
  long *plVar2;
  XMLCh *toTranscode;
  StrX local_20;
  
  plVar2 = (long *)(**(code **)(*(long *)xsComplexTypeDef + 0x30))();
  if (plVar2 != (long *)0x0) {
    std::operator<<((ostream *)&std::cout,"Base:\t\t\t");
    toTranscode = (XMLCh *)(**(code **)(*plVar2 + 0x10))(plVar2);
    StrX::StrX(&local_20,toTranscode);
    std::operator<<((ostream *)&std::cout,local_20.fLocalForm);
    std::operator<<((ostream *)&std::cout,"\n");
    StrX::~StrX(&local_20);
  }
  std::operator<<((ostream *)&std::cout,"Content Model:\t");
  uVar1 = xercesc_4_0::XSComplexTypeDefinition::getContentType();
  if ((uVar1 & 0xfffffffe) == 2) {
    processParticle(*(XSParticle **)(xsComplexTypeDef + 0x60));
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  }
  return;
}

Assistant:

void processComplexTypeDefinition(XSComplexTypeDefinition *xsComplexTypeDef)
{
    XSTypeDefinition *xsBaseTypeDef = xsComplexTypeDef->getBaseType();
    if (xsBaseTypeDef) {
        std::cout << "Base:\t\t\t";
        std::cout << StrX(xsBaseTypeDef->getName()) << "\n";
    }

    std::cout << "Content Model:\t";
    XSComplexTypeDefinition::CONTENT_TYPE contentType = xsComplexTypeDef->getContentType();
    if (contentType == XSComplexTypeDefinition::CONTENTTYPE_ELEMENT ||
        contentType == XSComplexTypeDefinition::CONTENTTYPE_MIXED) {
        processParticle(xsComplexTypeDef->getParticle());
        std::cout << std::endl;
    }
}